

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O2

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> T,
              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,int *C,int *B,
              int n,int k)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (C == B) {
    getCounts<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (T,C,n,k);
  }
  uVar11 = 0;
  getBuckets<int*,int>(C,B,k,false);
  uVar9 = n - 1;
  uVar8 = (ulong)T._M_current[(long)n + -1];
  iVar7 = B[uVar8];
  uVar3 = uVar9;
  if ((1 < n) && (uVar3 = -n, T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2])) {
    uVar3 = uVar9;
  }
  SA._M_current[iVar7] = uVar3;
  puVar2 = (uint *)(SA._M_current + iVar7 + 1);
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  for (; uVar4 != uVar11; uVar11 = uVar11 + 1) {
    uVar3 = SA._M_current[uVar11];
    uVar10 = (uint)uVar8;
    if ((long)(int)uVar3 < 1) {
      if (uVar3 != 0) {
        SA._M_current[uVar11] = ~uVar3;
      }
    }
    else {
      uVar6 = T._M_current[uVar3 - 1];
      SA._M_current[uVar11] = ~uVar6;
      if (uVar6 != uVar10) {
        B[(int)uVar10] = (int)((ulong)((long)puVar2 - (long)SA._M_current) >> 2);
        puVar2 = (uint *)(SA._M_current + B[(int)uVar6]);
        uVar10 = uVar6;
      }
      uVar6 = 0;
      if ((uVar3 != 1) && (uVar6 = uVar3 - 1, T._M_current[(long)(int)uVar3 + -2] < (int)uVar10)) {
        uVar6 = -uVar3;
      }
      *puVar2 = uVar6;
      puVar2 = puVar2 + 1;
    }
    uVar8 = (ulong)uVar10;
  }
  if (C == B) {
    getCounts<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (T,C,n,k);
  }
  getBuckets<int*,int>(C,B,k,true);
  piVar5 = SA._M_current + *B;
  iVar7 = 0;
  uVar8 = 0xffffffffffffffff;
  for (; uVar11 = (ulong)uVar9, -1 < (int)uVar9; uVar9 = uVar9 - 1) {
    uVar3 = SA._M_current[uVar11];
    if ((long)(int)uVar3 < 1) {
      if (uVar3 != 0) {
        SA._M_current[uVar11] = ~uVar3;
        uVar11 = uVar8;
      }
    }
    else {
      iVar1 = T._M_current[uVar3 - 1];
      SA._M_current[uVar11] = iVar1;
      if (iVar1 != iVar7) {
        B[iVar7] = (int)((ulong)((long)piVar5 - (long)SA._M_current) >> 2);
        piVar5 = SA._M_current + B[iVar1];
        iVar7 = iVar1;
      }
      uVar10 = 0;
      if ((uVar3 != 1) && (uVar10 = uVar3 - 1, iVar7 < T._M_current[(long)(int)uVar3 + -2])) {
        uVar10 = ~T._M_current[(long)(int)uVar3 + -2];
      }
      piVar5[-1] = uVar10;
      piVar5 = piVar5 + -1;
      uVar11 = uVar8;
    }
    uVar8 = uVar11;
  }
  return (int)uVar8;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}